

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O2

void uv__udp_io(uv_loop_t *loop,uv__io_t *w,uint revents)

{
  uint *handle;
  code *pcVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  int *piVar5;
  ulong uVar6;
  ulong uVar7;
  ssize_t sVar8;
  sockaddr_in6 *psVar9;
  long lVar10;
  ssize_t sVar11;
  long *plVar12;
  long lVar13;
  bool bVar14;
  uv_buf_t local_988;
  uint local_978;
  int local_974;
  uv_buf_t local_970;
  msghdr local_960;
  sockaddr_storage peer;
  uv__mmsghdr msgs [20];
  iovec iov [20];
  sockaddr_in6 peers [20];
  
  if (*(int *)&w[-2].cb != 0xf) {
    __assert_fail("handle->type == UV_UDP",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/udp.c"
                  ,0xaf,"void uv__udp_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  handle = &w[-3].pevents;
  if ((revents & 1) == 0) {
LAB_006186dc:
    if ((revents & 4) != 0) {
      uv__udp_sendmsg((uv_udp_t *)handle);
      uv__udp_run_completed((uv_udp_t *)handle);
    }
    return;
  }
  if (*(long *)&w[-1].fd == 0) {
    __assert_fail("handle->recv_cb != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/udp.c"
                  ,0x104,"void uv__udp_recvmsg(uv_udp_t *)");
  }
  lVar10._0_4_ = w[-1].pevents;
  lVar10._4_4_ = w[-1].events;
  local_978 = revents;
  if (lVar10 == 0) {
    __assert_fail("handle->alloc_cb != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/udp.c"
                  ,0x105,"void uv__udp_recvmsg(uv_udp_t *)");
  }
  iVar3 = 0x20;
LAB_006183af:
  local_988 = uv_buf_init((char *)0x0,0);
  (**(code **)&w[-1].pevents)(handle,0x10000,&local_988);
  if ((local_988.base != (char *)0x0) && (local_988.len != 0)) {
    iVar2 = uv_udp_using_recvmmsg((uv_udp_t *)handle);
    if (iVar2 != 0) {
      uVar7 = local_988.len >> 0x10;
      if (0x13 < local_988.len >> 0x10) {
        uVar7 = 0x14;
      }
      psVar9 = peers;
      pcVar4 = local_988.base;
      for (uVar6 = 0; local_974 = iVar3, (uint)uVar7 << 4 != uVar6; uVar6 = uVar6 + 0x10) {
        plVar12 = (long *)((long)&iov[0].iov_base + uVar6);
        *plVar12 = (long)pcVar4;
        *(undefined8 *)((long)&msgs[0].msg_hdr.msg_iov + uVar6 * 4) = 0;
        *(undefined8 *)((long)&msgs[0].msg_hdr.msg_iovlen + uVar6 * 4) = 0;
        *(undefined8 *)((long)&msgs[0].msg_hdr.msg_name + uVar6 * 4) = 0;
        *(undefined8 *)(&msgs[0].msg_hdr.msg_namelen + uVar6) = 0;
        *(undefined8 *)(&msgs[0].msg_hdr.msg_flags + uVar6) = 0;
        *(undefined8 *)((long)&msgs[0].msg_hdr.msg_control + uVar6 * 4) = 0;
        *(undefined8 *)((long)&msgs[0].msg_hdr.msg_controllen + uVar6 * 4) = 0;
        *(long **)((long)&msgs[0].msg_hdr.msg_iov + uVar6 * 4) = plVar12;
        *(undefined8 *)((long)&msgs[0].msg_hdr.msg_iovlen + uVar6 * 4) = 1;
        *(sockaddr_in6 **)((long)&msgs[0].msg_hdr.msg_name + uVar6 * 4) = psVar9;
        (&msgs[0].msg_hdr.msg_namelen)[uVar6] = 0x1c;
        (&msgs[0].msg_hdr.msg_flags)[uVar6] = 0;
        *(undefined8 *)((long)&iov[0].iov_len + uVar6) = 0x10000;
        psVar9 = psVar9 + 1;
        pcVar4 = pcVar4 + 0x10000;
      }
      do {
        iVar3 = uv__recvmmsg(w->fd,msgs,(uint)uVar7);
        if (iVar3 != -1) {
          if (0 < iVar3) {
            lVar13 = (long)iVar3;
            lVar10 = 0;
            goto LAB_0061859c;
          }
          if (iVar3 == 0) goto LAB_006184d4;
          piVar5 = __errno_location();
          iVar2 = *piVar5;
          break;
        }
        piVar5 = __errno_location();
        iVar2 = *piVar5;
      } while (iVar2 == 4);
      if (iVar2 == 0xb) {
LAB_006184d4:
        lVar10 = 0;
      }
      else {
        lVar10 = (long)-iVar2;
      }
      (**(code **)&w[-1].fd)(handle,lVar10,&local_988);
      goto LAB_00618619;
    }
    local_960.msg_controllen = 0;
    local_960.msg_flags = 0;
    local_960._52_4_ = 0;
    local_960.msg_control = (void *)0x0;
    peer.__ss_padding[0x6e] = '\0';
    peer.__ss_padding[0x6f] = '\0';
    peer.__ss_padding[0x70] = '\0';
    peer.__ss_padding[0x71] = '\0';
    peer.__ss_padding[0x72] = '\0';
    peer.__ss_padding[0x73] = '\0';
    peer.__ss_padding[0x74] = '\0';
    peer.__ss_padding[0x75] = '\0';
    peer.__ss_align = 0;
    peer.__ss_padding[0x5e] = '\0';
    peer.__ss_padding[0x5f] = '\0';
    peer.__ss_padding[0x60] = '\0';
    peer.__ss_padding[0x61] = '\0';
    peer.__ss_padding[0x62] = '\0';
    peer.__ss_padding[99] = '\0';
    peer.__ss_padding[100] = '\0';
    peer.__ss_padding[0x65] = '\0';
    peer.__ss_padding[0x66] = '\0';
    peer.__ss_padding[0x67] = '\0';
    peer.__ss_padding[0x68] = '\0';
    peer.__ss_padding[0x69] = '\0';
    peer.__ss_padding[0x6a] = '\0';
    peer.__ss_padding[0x6b] = '\0';
    peer.__ss_padding[0x6c] = '\0';
    peer.__ss_padding[0x6d] = '\0';
    peer.__ss_padding[0x4e] = '\0';
    peer.__ss_padding[0x4f] = '\0';
    peer.__ss_padding[0x50] = '\0';
    peer.__ss_padding[0x51] = '\0';
    peer.__ss_padding[0x52] = '\0';
    peer.__ss_padding[0x53] = '\0';
    peer.__ss_padding[0x54] = '\0';
    peer.__ss_padding[0x55] = '\0';
    peer.__ss_padding[0x56] = '\0';
    peer.__ss_padding[0x57] = '\0';
    peer.__ss_padding[0x58] = '\0';
    peer.__ss_padding[0x59] = '\0';
    peer.__ss_padding[0x5a] = '\0';
    peer.__ss_padding[0x5b] = '\0';
    peer.__ss_padding[0x5c] = '\0';
    peer.__ss_padding[0x5d] = '\0';
    peer.__ss_padding[0x3e] = '\0';
    peer.__ss_padding[0x3f] = '\0';
    peer.__ss_padding[0x40] = '\0';
    peer.__ss_padding[0x41] = '\0';
    peer.__ss_padding[0x42] = '\0';
    peer.__ss_padding[0x43] = '\0';
    peer.__ss_padding[0x44] = '\0';
    peer.__ss_padding[0x45] = '\0';
    peer.__ss_padding[0x46] = '\0';
    peer.__ss_padding[0x47] = '\0';
    peer.__ss_padding[0x48] = '\0';
    peer.__ss_padding[0x49] = '\0';
    peer.__ss_padding[0x4a] = '\0';
    peer.__ss_padding[0x4b] = '\0';
    peer.__ss_padding[0x4c] = '\0';
    peer.__ss_padding[0x4d] = '\0';
    peer.__ss_padding[0x2e] = '\0';
    peer.__ss_padding[0x2f] = '\0';
    peer.__ss_padding[0x30] = '\0';
    peer.__ss_padding[0x31] = '\0';
    peer.__ss_padding[0x32] = '\0';
    peer.__ss_padding[0x33] = '\0';
    peer.__ss_padding[0x34] = '\0';
    peer.__ss_padding[0x35] = '\0';
    peer.__ss_padding[0x36] = '\0';
    peer.__ss_padding[0x37] = '\0';
    peer.__ss_padding[0x38] = '\0';
    peer.__ss_padding[0x39] = '\0';
    peer.__ss_padding[0x3a] = '\0';
    peer.__ss_padding[0x3b] = '\0';
    peer.__ss_padding[0x3c] = '\0';
    peer.__ss_padding[0x3d] = '\0';
    peer.__ss_padding[0x1e] = '\0';
    peer.__ss_padding[0x1f] = '\0';
    peer.__ss_padding[0x20] = '\0';
    peer.__ss_padding[0x21] = '\0';
    peer.__ss_padding[0x22] = '\0';
    peer.__ss_padding[0x23] = '\0';
    peer.__ss_padding[0x24] = '\0';
    peer.__ss_padding[0x25] = '\0';
    peer.__ss_padding[0x26] = '\0';
    peer.__ss_padding[0x27] = '\0';
    peer.__ss_padding[0x28] = '\0';
    peer.__ss_padding[0x29] = '\0';
    peer.__ss_padding[0x2a] = '\0';
    peer.__ss_padding[0x2b] = '\0';
    peer.__ss_padding[0x2c] = '\0';
    peer.__ss_padding[0x2d] = '\0';
    peer.__ss_padding[0xe] = '\0';
    peer.__ss_padding[0xf] = '\0';
    peer.__ss_padding[0x10] = '\0';
    peer.__ss_padding[0x11] = '\0';
    peer.__ss_padding[0x12] = '\0';
    peer.__ss_padding[0x13] = '\0';
    peer.__ss_padding[0x14] = '\0';
    peer.__ss_padding[0x15] = '\0';
    peer.__ss_padding[0x16] = '\0';
    peer.__ss_padding[0x17] = '\0';
    peer.__ss_padding[0x18] = '\0';
    peer.__ss_padding[0x19] = '\0';
    peer.__ss_padding[0x1a] = '\0';
    peer.__ss_padding[0x1b] = '\0';
    peer.__ss_padding[0x1c] = '\0';
    peer.__ss_padding[0x1d] = '\0';
    peer.ss_family = 0;
    peer.__ss_padding[0] = '\0';
    peer.__ss_padding[1] = '\0';
    peer.__ss_padding[2] = '\0';
    peer.__ss_padding[3] = '\0';
    peer.__ss_padding[4] = '\0';
    peer.__ss_padding[5] = '\0';
    peer.__ss_padding[6] = '\0';
    peer.__ss_padding[7] = '\0';
    peer.__ss_padding[8] = '\0';
    peer.__ss_padding[9] = '\0';
    peer.__ss_padding[10] = '\0';
    peer.__ss_padding[0xb] = '\0';
    peer.__ss_padding[0xc] = '\0';
    peer.__ss_padding[0xd] = '\0';
    local_960.msg_name = &peer;
    local_960.msg_namelen = 0x80;
    local_960._12_4_ = 0;
    local_960.msg_iovlen = 1;
    local_960.msg_iov = (iovec *)&local_988;
    do {
      sVar8 = recvmsg(w->fd,&local_960,0);
      sVar11 = sVar8;
      if (sVar8 != -1) goto LAB_0061866a;
      piVar5 = __errno_location();
      iVar2 = *piVar5;
    } while ((long)iVar2 == 4);
    if (iVar2 == 0xb) {
      sVar11 = 0;
    }
    else {
      sVar11 = -(long)iVar2;
    }
LAB_0061866a:
    (**(code **)&w[-1].fd)(handle,sVar11,&local_988);
    iVar3 = iVar3 + -1;
    goto LAB_00618670;
  }
  (**(code **)&w[-1].fd)(handle,0xffffffffffffff97,&local_988,0,0);
  revents = local_978;
  goto LAB_006186dc;
LAB_0061859c:
  pcVar1 = *(code **)&w[-1].fd;
  bVar14 = lVar13 == 0;
  lVar13 = lVar13 + -1;
  if (bVar14) goto LAB_006186a0;
  if (pcVar1 == (code *)0x0) goto LAB_00618619;
  local_970 = uv_buf_init(*(char **)((long)&iov[0].iov_base + lVar10),
                          *(uint *)((long)&iov[0].iov_len + lVar10));
  (**(code **)&w[-1].fd)(handle,(&msgs[0].msg_len)[lVar10],&local_970);
  lVar10 = lVar10 + 0x10;
  goto LAB_0061859c;
LAB_006186a0:
  if (pcVar1 != (code *)0x0) {
    (*pcVar1)(handle,0,&local_988);
  }
LAB_00618619:
  sVar8 = (ssize_t)iVar3;
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  iVar3 = local_974 - iVar3;
LAB_00618670:
  revents = local_978;
  if ((((sVar8 == -1) || (iVar3 < 1)) || (w->fd == -1)) || (*(long *)&w[-1].fd == 0))
  goto LAB_006186dc;
  goto LAB_006183af;
}

Assistant:

static void uv__udp_io(uv_loop_t* loop, uv__io_t* w, unsigned int revents) {
  uv_udp_t* handle;

  handle = container_of(w, uv_udp_t, io_watcher);
  assert(handle->type == UV_UDP);

  if (revents & POLLIN)
    uv__udp_recvmsg(handle);

  if (revents & POLLOUT) {
    uv__udp_sendmsg(handle);
    uv__udp_run_completed(handle);
  }
}